

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

ExecutionResult __thiscall nigel::Lexer::onExecute(Lexer *this,CodeBase *base)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  reference pvVar4;
  element_type *peVar5;
  ulong uVar6;
  undefined1 *puVar7;
  element_type *peVar8;
  char *pcVar9;
  __shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var10;
  element_type *peVar11;
  ulong uVar12;
  shared_ptr<nigel::Token> local_138;
  undefined1 local_128 [48];
  undefined1 local_f8 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [24];
  int multiCommentCount;
  bool isMultiComment;
  bool isLineComment;
  bool isString;
  bool finish;
  String tmpStr;
  u8 previousC;
  element_type *peStack_20;
  u8 c;
  size_t fileLine;
  CodeBase *base_local;
  Lexer *this_local;
  
  peStack_20 = (element_type *)0x0;
  tmpStr.field_2._M_local_buf[0xe] = '\0';
  std::__cxx11::string::string((string *)&multiCommentCount);
  local_60[0x17] = 0;
  this->currLineNo = 1;
  this->currColumnNo = 0;
  local_60[0x16] = 0;
  local_60[0x15] = 0;
  local_60[0x14] = 0;
  local_60._16_4_ = 0;
  bVar1 = std::vector<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>::
          empty(&base->fileCont);
  if (!bVar1) {
    pvVar4 = std::
             vector<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>::
             operator[](&base->fileCont,0);
    std::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&this->currLine,&pvVar4->content);
    pvVar4 = std::
             vector<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>::
             operator[](&base->fileCont,0);
    std::shared_ptr<boost::filesystem::path>::operator=(&this->currPath,&pvVar4->path);
  }
  do {
    if (((local_60[0x17] ^ 0xff) & 1) == 0) {
      std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&local_138);
      makeToken((Lexer *)local_128,(shared_ptr<nigel::Token> *)this);
      std::__cxx11::
      list<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>::
      push_back(&base->lexerStruct,(value_type *)local_128);
      std::shared_ptr<nigel::Token>::~shared_ptr((shared_ptr<nigel::Token> *)local_128);
      std::shared_ptr<nigel::Token>::~shared_ptr(&local_138);
      postLexer(this,base);
      if ((base->printLexer & 1U) != 0) {
        printLexerStructure(this,base);
      }
      std::__cxx11::string::~string((string *)&multiCommentCount);
      return success;
    }
    while( true ) {
      peVar5 = (element_type *)
               std::
               vector<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>::
               size(&base->fileCont);
      bVar1 = false;
      if (peStack_20 < peVar5) {
        uVar12 = this->currColumnNo;
        pvVar4 = std::
                 vector<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>
                 ::operator[](&base->fileCont,(size_type)peStack_20);
        std::
        __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)pvVar4);
        uVar6 = std::__cxx11::string::size();
        bVar1 = uVar6 <= uVar12;
      }
      if (!bVar1) break;
      if ((local_60[0x15] & 1) != 0) {
        std::make_shared<nigel::Token_Comment,std::__cxx11::string&>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_a0 + 0x20));
        std::shared_ptr<nigel::Token>::shared_ptr<nigel::Token_Comment,void>
                  ((shared_ptr<nigel::Token> *)&local_80.field_2,
                   (shared_ptr<nigel::Token_Comment> *)(local_a0 + 0x20));
        makeToken((Lexer *)local_60,(shared_ptr<nigel::Token> *)this);
        std::__cxx11::
        list<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>::
        push_back(&base->lexerStruct,(value_type *)local_60);
        std::shared_ptr<nigel::Token>::~shared_ptr((shared_ptr<nigel::Token> *)local_60);
        std::shared_ptr<nigel::Token>::~shared_ptr((shared_ptr<nigel::Token> *)&local_80.field_2);
        std::shared_ptr<nigel::Token_Comment>::~shared_ptr
                  ((shared_ptr<nigel::Token_Comment> *)(local_a0 + 0x20));
        std::__cxx11::string::clear();
        local_60[0x15] = 0;
      }
      this->currColumnNo = 0;
      peStack_20 = (element_type *)&peStack_20->field_0x1;
      puVar7 = (undefined1 *)
               std::
               vector<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>::
               size(&base->fileCont);
      if (peStack_20 < puVar7) {
        pvVar4 = std::
                 vector<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>
                 ::operator[](&base->fileCont,(size_type)peStack_20);
        this->currLineNo = pvVar4->line;
        pvVar4 = std::
                 vector<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>
                 ::operator[](&base->fileCont,(size_type)peStack_20);
        std::
        shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator=(&this->currLine,&pvVar4->content);
        pvVar4 = std::
                 vector<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>
                 ::operator[](&base->fileCont,(size_type)peStack_20);
        std::shared_ptr<boost::filesystem::path>::operator=(&this->currPath,&pvVar4->path);
      }
    }
    peVar5 = (element_type *)
             std::
             vector<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>::
             size(&base->fileCont);
    if (peStack_20 < peVar5) {
      pvVar4 = std::
               vector<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>::
               operator[](&base->fileCont,(size_type)peStack_20);
      peVar8 = std::
               __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)pvVar4);
      this->currColumnNo = this->currColumnNo + 1;
      pcVar9 = (char *)std::__cxx11::string::at((ulong)peVar8);
      tmpStr.field_2._M_local_buf[0xf] = *pcVar9;
    }
    else {
      local_60[0x17] = 1;
      tmpStr.field_2._M_local_buf[0xf] = '\0';
    }
    if (((local_60[0x16] & 1) == 0) ||
       ((tmpStr.field_2._M_local_buf[0xf] == '\"' && (tmpStr.field_2._M_local_buf[0xe] != '\\')))) {
      if ((local_60[0x15] & 1) == 0) {
        if ((local_60[0x14] & 1) == 0) {
          bVar1 = isWhitespace(this,tmpStr.field_2._M_local_buf[0xf]);
          if (bVar1) {
            uVar12 = std::__cxx11::string::empty();
            if ((uVar12 & 1) == 0) {
              adoptToken(this,(String *)&multiCommentCount,base);
            }
            this->previousColumnNo = this->previousColumnNo + 1;
          }
          else {
            bVar1 = isOperator(this,tmpStr.field_2._M_local_buf[0xf]);
            if (bVar1) {
              if ((tmpStr.field_2._M_local_buf[0xf] == '/') &&
                 (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&multiCommentCount,"/"), bVar1)) {
                local_60[0x15] = 1;
                std::__cxx11::string::clear();
              }
              else if ((tmpStr.field_2._M_local_buf[0xf] == '*') &&
                      (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&multiCommentCount,"/"), bVar1)) {
                local_60[0x14] = 1;
                local_60._16_4_ = local_60._16_4_ + 1;
                std::__cxx11::string::clear();
              }
              else {
                bVar1 = isOperator(this,tmpStr.field_2._M_local_buf[0xe]);
                if ((bVar1) || (uVar12 = std::__cxx11::string::empty(), (uVar12 & 1) != 0)) {
                  std::__cxx11::string::operator+=
                            ((string *)&multiCommentCount,tmpStr.field_2._M_local_buf[0xf]);
                }
                else {
                  uVar12 = std::__cxx11::string::empty();
                  if ((uVar12 & 1) == 0) {
                    adoptToken(this,(String *)&multiCommentCount,base);
                    std::__cxx11::string::operator+=
                              ((string *)&multiCommentCount,tmpStr.field_2._M_local_buf[0xf]);
                  }
                }
              }
            }
            else {
              bVar1 = isNumber(this,tmpStr.field_2._M_local_buf[0xf]);
              if (((bVar1) ||
                  ((tmpStr.field_2._M_local_buf[0xf] == 'x' &&
                   (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&multiCommentCount,"0"), bVar1)))) ||
                 ((bVar1 = isHexValue(this,tmpStr.field_2._M_local_buf[0xf]), bVar1 &&
                  (((uVar12 = std::__cxx11::string::size(), 1 < uVar12 &&
                    (pcVar9 = (char *)std::__cxx11::string::operator[]((ulong)&multiCommentCount),
                    *pcVar9 == '0')) &&
                   (pcVar9 = (char *)std::__cxx11::string::operator[]((ulong)&multiCommentCount),
                   *pcVar9 == 'x')))))) {
                bVar2 = std::__cxx11::string::empty();
                local_f8[0x17] = 0;
                bVar1 = true;
                if ((bVar2 & 1) == 0) {
                  bVar3 = isNumber(this,tmpStr.field_2._M_local_buf[0xe]);
                  bVar1 = true;
                  if (!bVar3) {
                    pcVar9 = (char *)std::__cxx11::string::front();
                    bVar3 = isIdentifier(this,*pcVar9);
                    bVar1 = true;
                    if ((!bVar3) && (bVar1 = true, tmpStr.field_2._M_local_buf[0xe] != '0')) {
                      std::__cxx11::string::substr
                                ((ulong)(local_f8 + 0x18),(ulong)&multiCommentCount);
                      local_f8[0x17] = 1;
                      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)(local_f8 + 0x18),"0x");
                      bVar1 = true;
                      if (!bVar3) {
                        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)&multiCommentCount,"-");
                        if (!bVar1) {
                          bVar3 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&multiCommentCount,"+");
                          bVar1 = false;
                          if (!bVar3) goto LAB_00250822;
                        }
                        bVar3 = std::__cxx11::
                                list<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>
                                ::empty(&base->lexerStruct);
                        bVar1 = true;
                        if (!bVar3) {
                          p_Var10 = (__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)std::__cxx11::
                                       list<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>
                                       ::back(&base->lexerStruct);
                          peVar11 = std::
                                    __shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    ::operator->(p_Var10);
                          bVar1 = true;
                          if (peVar11->type != operatorToken) {
                            p_Var10 = (__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)std::__cxx11::
                                         list<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>
                                         ::back(&base->lexerStruct);
                            peVar11 = std::
                                      __shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      ::operator->(p_Var10);
                            bVar1 = peVar11->type == dividingToken;
                          }
                        }
                      }
                    }
                  }
                }
LAB_00250822:
                if ((local_f8[0x17] & 1) != 0) {
                  std::__cxx11::string::~string((string *)(local_f8 + 0x18));
                }
                if (bVar1) {
                  std::__cxx11::string::operator+=
                            ((string *)&multiCommentCount,tmpStr.field_2._M_local_buf[0xf]);
                }
                else {
                  uVar12 = std::__cxx11::string::empty();
                  if ((uVar12 & 1) == 0) {
                    adoptToken(this,(String *)&multiCommentCount,base);
                    std::__cxx11::string::operator+=
                              ((string *)&multiCommentCount,tmpStr.field_2._M_local_buf[0xf]);
                  }
                }
              }
              else {
                bVar1 = isDividingToken(this,tmpStr.field_2._M_local_buf[0xf]);
                if ((!bVar1) ||
                   (bVar1 = isDividingToken(this,tmpStr.field_2._M_local_buf[0xe]), bVar1)) {
                  if ((tmpStr.field_2._M_local_buf[0xe] == '\0') ||
                     (bVar1 = isIdentifier(this,tmpStr.field_2._M_local_buf[0xe]), bVar1)) {
                    std::__cxx11::string::operator+=
                              ((string *)&multiCommentCount,tmpStr.field_2._M_local_buf[0xf]);
                  }
                  else {
                    adoptToken(this,(String *)&multiCommentCount,base);
                    std::__cxx11::string::operator+=
                              ((string *)&multiCommentCount,tmpStr.field_2._M_local_buf[0xf]);
                  }
                }
                else if (tmpStr.field_2._M_local_buf[0xf] == '\"') {
                  if ((local_60[0x16] & 1) == 0) {
                    uVar12 = std::__cxx11::string::empty();
                    if ((uVar12 & 1) != 0) {
                      local_60[0x16] = 1;
                    }
                  }
                  else {
                    std::make_shared<nigel::Token_StringL,std::__cxx11::string&>
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (local_128 + 0x10));
                    std::shared_ptr<nigel::Token>::shared_ptr<nigel::Token_StringL,void>
                              ((shared_ptr<nigel::Token> *)(local_128 + 0x20),
                               (shared_ptr<nigel::Token_StringL> *)(local_128 + 0x10));
                    makeToken((Lexer *)local_f8,(shared_ptr<nigel::Token> *)this);
                    std::__cxx11::
                    list<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>
                    ::push_back(&base->lexerStruct,(value_type *)local_f8);
                    std::shared_ptr<nigel::Token>::~shared_ptr((shared_ptr<nigel::Token> *)local_f8)
                    ;
                    std::shared_ptr<nigel::Token>::~shared_ptr
                              ((shared_ptr<nigel::Token> *)(local_128 + 0x20));
                    std::shared_ptr<nigel::Token_StringL>::~shared_ptr
                              ((shared_ptr<nigel::Token_StringL> *)(local_128 + 0x10));
                    std::__cxx11::string::clear();
                    local_60[0x16] = 0;
                  }
                }
                else {
                  bVar1 = isDividingToken(this,tmpStr.field_2._M_local_buf[0xe]);
                  if ((bVar1) || (uVar12 = std::__cxx11::string::empty(), (uVar12 & 1) != 0)) {
                    std::__cxx11::string::operator+=
                              ((string *)&multiCommentCount,tmpStr.field_2._M_local_buf[0xf]);
                  }
                  else {
                    uVar12 = std::__cxx11::string::empty();
                    if ((uVar12 & 1) == 0) {
                      adoptToken(this,(String *)&multiCommentCount,base);
                      std::__cxx11::string::operator+=
                                ((string *)&multiCommentCount,tmpStr.field_2._M_local_buf[0xf]);
                    }
                  }
                }
              }
            }
          }
        }
        else {
          std::__cxx11::string::operator+=
                    ((string *)&multiCommentCount,tmpStr.field_2._M_local_buf[0xf]);
          if (((tmpStr.field_2._M_local_buf[0xe] == '*') &&
              (tmpStr.field_2._M_local_buf[0xf] == '/')) &&
             (local_60._16_4_ = local_60._16_4_ + -1, local_60._16_4_ == 0)) {
            std::__cxx11::string::pop_back();
            std::__cxx11::string::pop_back();
            std::make_shared<nigel::Token_Comment,std::__cxx11::string&>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_f8 + 0x38));
            std::shared_ptr<nigel::Token>::shared_ptr<nigel::Token_Comment,void>
                      ((shared_ptr<nigel::Token> *)&local_c0.field_2,
                       (shared_ptr<nigel::Token_Comment> *)(local_f8 + 0x38));
            makeToken((Lexer *)local_a0,(shared_ptr<nigel::Token> *)this);
            std::__cxx11::
            list<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>::
            push_back(&base->lexerStruct,(value_type *)local_a0);
            std::shared_ptr<nigel::Token>::~shared_ptr((shared_ptr<nigel::Token> *)local_a0);
            std::shared_ptr<nigel::Token>::~shared_ptr
                      ((shared_ptr<nigel::Token> *)&local_c0.field_2);
            std::shared_ptr<nigel::Token_Comment>::~shared_ptr
                      ((shared_ptr<nigel::Token_Comment> *)(local_f8 + 0x38));
            std::__cxx11::string::clear();
            local_60[0x14] = 0;
          }
          if ((tmpStr.field_2._M_local_buf[0xe] == '/') && (tmpStr.field_2._M_local_buf[0xf] == '*')
             ) {
            local_60._16_4_ = local_60._16_4_ + 1;
          }
        }
      }
      else {
        std::__cxx11::string::operator+=
                  ((string *)&multiCommentCount,tmpStr.field_2._M_local_buf[0xf]);
      }
    }
    else if (tmpStr.field_2._M_local_buf[0xe] == '\\') {
      if (tmpStr.field_2._M_local_buf[0xf] == '\\') {
        std::__cxx11::string::operator+=((string *)&multiCommentCount,'\\');
      }
      else if (tmpStr.field_2._M_local_buf[0xf] == 'n') {
        std::__cxx11::string::operator+=((string *)&multiCommentCount,'\n');
      }
      else if (tmpStr.field_2._M_local_buf[0xf] == 'r') {
        std::__cxx11::string::operator+=((string *)&multiCommentCount,'\r');
      }
      else if (tmpStr.field_2._M_local_buf[0xf] == 't') {
        std::__cxx11::string::operator+=((string *)&multiCommentCount,'\t');
      }
      else if (tmpStr.field_2._M_local_buf[0xf] == 'v') {
        std::__cxx11::string::operator+=((string *)&multiCommentCount,'\v');
      }
      else if (tmpStr.field_2._M_local_buf[0xf] == 'b') {
        std::__cxx11::string::operator+=((string *)&multiCommentCount,'\b');
      }
      else if (tmpStr.field_2._M_local_buf[0xf] == 'f') {
        std::__cxx11::string::operator+=((string *)&multiCommentCount,'\f');
      }
      else if (tmpStr.field_2._M_local_buf[0xf] == 'a') {
        std::__cxx11::string::operator+=((string *)&multiCommentCount,'\a');
      }
      else if (tmpStr.field_2._M_local_buf[0xf] == '?') {
        std::__cxx11::string::operator+=((string *)&multiCommentCount,'?');
      }
      else if (tmpStr.field_2._M_local_buf[0xf] == '\'') {
        std::__cxx11::string::operator+=((string *)&multiCommentCount,'\'');
      }
      else if (tmpStr.field_2._M_local_buf[0xf] == '\"') {
        std::__cxx11::string::operator+=((string *)&multiCommentCount,'\"');
      }
      else if (tmpStr.field_2._M_local_buf[0xf] == '0') {
        std::__cxx11::string::operator+=((string *)&multiCommentCount,'\0');
      }
    }
    else if (tmpStr.field_2._M_local_buf[0xf] != '\\') {
      std::__cxx11::string::operator+=
                ((string *)&multiCommentCount,tmpStr.field_2._M_local_buf[0xf]);
    }
    if (tmpStr.field_2._M_local_buf[0xe] == '\\') {
      tmpStr.field_2._M_local_buf[0xe] = '\0';
    }
    else {
      tmpStr.field_2._M_local_buf[0xe] = tmpStr.field_2._M_local_buf[0xf];
    }
  } while( true );
}

Assistant:

ExecutionResult Lexer::onExecute( CodeBase &base )
	{
		size_t fileLine = 0;
		//size_t fileColumn = 0;

		u8 c, previousC = 0;
		String tmpStr;
		bool finish = false;
		currLineNo = 1;
		currColumnNo = 0;

		//Special values
		bool isString = false;//If is string literal
		bool isLineComment = false;//If is comment from // untile lineend
		bool isMultiComment = false;//If is multiline-comment with /* */
		int multiCommentCount = 0;//Enables nested comments
		if( !base.fileCont.empty() )
		{
			currLine = base.fileCont[0].content;
			currPath = base.fileCont[0].path;
		}

		while( !finish )
		{//Iterate whole file content
			while( fileLine < base.fileCont.size() && currColumnNo >= base.fileCont[fileLine].content->size() )
			{//Newline
				if( isLineComment )
				{
					base.lexerStruct.push_back( makeToken( std::make_shared<Token_Comment>( tmpStr ) ) );
					tmpStr.clear();
					isLineComment = false;
				}
				currColumnNo = 0;
				fileLine++;
				if( fileLine < base.fileCont.size() )
				{
					currLineNo = base.fileCont[fileLine].line;
					currLine = base.fileCont[fileLine].content;
					currPath = base.fileCont[fileLine].path;
				}
			}
			if( fileLine >= base.fileCont.size() )
			{
				finish = true;
				c = 0;
			}
			else c = base.fileCont[fileLine].content->at( currColumnNo++ );


			if( isString && ( c != '"' || previousC == '\\'  ) )
			{//Capture string literal
				if( previousC == '\\' )
				{
					if( c == '\\' ) tmpStr += '\\';//Backslash
					else if( c == 'n' ) tmpStr += '\n';//Newline
					else if( c == 'r' ) tmpStr += '\r';//Carriage return
					else if( c == 't' ) tmpStr += '\t';//Tabulator
					else if( c == 'v' ) tmpStr += '\v';//Vertical tabulator
					else if( c == 'b' ) tmpStr += '\b';//Backspace
					else if( c == 'f' ) tmpStr += '\f';//Form feed
					else if( c == 'a' ) tmpStr += '\a';//Alert
					else if( c == '?' ) tmpStr += '\?';//Question mark
					else if( c == '\'' ) tmpStr += '\'';//Single quote
					else if( c == '"' ) tmpStr += '\"';//Double quote
					else if( c == '0' ) tmpStr += '\0';//Null as value, not as character.
				}
				else if( c != '\\' ) tmpStr += c;
			}
			else if( isLineComment )
			{//Capture comment
				tmpStr += c;
			}
			else if( isMultiComment )
			{//Capture comment
				tmpStr += c;
				if( previousC == '*' && c == '/' )
				{//Comment finished
					multiCommentCount--;
					if( multiCommentCount == 0 )
					{
						tmpStr.pop_back();//Remove *
						tmpStr.pop_back();//Remove /

						base.lexerStruct.push_back( makeToken( std::make_shared<Token_Comment>( tmpStr ) ) );
						tmpStr.clear();
						isMultiComment = false;
					}
				}
				if( previousC == '/' && c == '*' ) multiCommentCount++;
			}


			else if( isWhitespace( c ) )
			{//Ignore and split token
				if( !tmpStr.empty() )
				{//Finish previous token
					adoptToken( tmpStr, base );
				}
				previousColumnNo++;
			}
			else if( isOperator( c ) )
			{
				if( c == '/' && tmpStr == "/" )
				{//Found comment with //
					isLineComment = true;
					tmpStr.clear();
				}
				else if( c == '*' && tmpStr == "/" )
				{//Found comment with /*
					isMultiComment = true;
					multiCommentCount++;
					tmpStr.clear();
				}

				else if( isOperator( previousC ) || tmpStr.empty() ) tmpStr += c;
				else if( !tmpStr.empty() )
				{//Finish previous token
					adoptToken( tmpStr, base );
					tmpStr += c;
				}
			}
			else if (isNumber(c) || (c == 'x' && tmpStr == "0") || ( isHexValue(c) && tmpStr.size() >=2 && tmpStr[0] == '0' && tmpStr[1] == 'x'))
			{
				if( tmpStr.empty() || isNumber( previousC ) || isIdentifier( tmpStr.front() ) || previousC == '0' || tmpStr.substr(0, 2) == "0x" ||
					( ( tmpStr == "-" || tmpStr == "+" ) && ( base.lexerStruct.empty() || base.lexerStruct.back()->type == Token::Type::operatorToken || base.lexerStruct.back()->type == Token::Type::dividingToken ) )
					) tmpStr += c;
				else if( !tmpStr.empty() )
				{//Finish previous token
					adoptToken( tmpStr, base );
					tmpStr += c;
				}
			}
			else if( isDividingToken( c ) && !isDividingToken( previousC ) )
			{
				if( c == '"' )
				{
					if( isString )
					{//Admit string
						base.lexerStruct.push_back( makeToken( std::make_shared<Token_StringL>( tmpStr ) ) );
						tmpStr.clear();
						isString = false;
					}
					else if( tmpStr.empty() ) isString = true;
				}
				else
				{
					if( isDividingToken( previousC ) || tmpStr.empty() ) tmpStr += c;
					else if( !tmpStr.empty() )
					{//Finish previous token
						adoptToken( tmpStr, base );
						tmpStr += c;
					}
				}
			}
			else
			{
				if( previousC == 0 || isIdentifier( previousC ) )
					tmpStr += c;
				else
				{//Finish previous token
					adoptToken( tmpStr, base );
					tmpStr += c;
				}
			}

			if( previousC != '\\' ) previousC = c;
			else previousC = 0;
		}
		base.lexerStruct.push_back( makeToken( std::make_shared<Token>( Token::Type::eof ) ) );

		postLexer( base );

		if( base.printLexer ) printLexerStructure( base );

		return ExecutionResult::success;
	}